

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st.c
# Opt level: O0

void onig_st_free_table(st_table *table)

{
  st_table_entry *psVar1;
  int local_24;
  int i;
  st_table_entry *next;
  st_table_entry *ptr;
  st_table *table_local;
  
  for (local_24 = 0; local_24 < table->num_bins; local_24 = local_24 + 1) {
    next = table->bins[local_24];
    while (next != (st_table_entry *)0x0) {
      psVar1 = next->next;
      free(next);
      next = psVar1;
    }
  }
  free(table->bins);
  free(table);
  return;
}

Assistant:

extern void
st_free_table(st_table* table)
{
  register st_table_entry *ptr, *next;
  int i;

  for(i = 0; i < table->num_bins; i++) {
    ptr = table->bins[i];
    while (ptr != 0) {
	    next = ptr->next;
	    free(ptr);
	    ptr = next;
    }
  }
  free(table->bins);
  free(table);
}